

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

size_t __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::alloc_leaf
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this)

{
  size_t sVar1;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_RDI;
  size_t leaf;
  size_type in_stack_00000018;
  deque<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  *in_stack_00000020;
  
  sVar1 = in_RDI->free_leaf;
  in_RDI->free_leaf = sVar1 + 1;
  used_leaves(in_RDI);
  std::
  deque<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ::resize(in_stack_00000020,in_stack_00000018);
  return sVar1;
}

Assistant:

size_t bt_impl<W, AP>::alloc_leaf() {
            assert(used_leaves() < leaves_count &&
                   "Maximum number of leaves exceeded");
            
            size_t leaf = free_leaf++;
            
            if(AP == alloc_on_demand)
                leaves.resize(used_leaves());
            
            return leaf;
        }